

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicy.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen12dGPUCachePolicy::InitCachePolicy(GmmGen12dGPUCachePolicy *this)

{
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 *paVar1;
  PRODUCT_FAMILY PVar2;
  PRODUCT_FAMILY PVar3;
  undefined4 uVar4;
  GMM_CACHE_POLICY_ELEMENT *pGVar5;
  ulong uVar6;
  undefined4 uVar8;
  Context *pCVar7;
  ushort uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  GMM_CACHE_POLICY_ELEMENT CachePolicyUsage;
  ushort uVar12;
  GMM_CACHE_POLICY_ELEMENT *pGVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  GMM_PRIVATE_PAT *pGVar17;
  ushort uVar19;
  uint uVar20;
  uint32_t Usage;
  uint64_t uVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  undefined8 in_stack_ffffffffffffffb0;
  uint64_t local_48;
  uint64_t PTEValue;
  GmmGen12dGPUCachePolicy *local_38;
  ulong uVar18;
  
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  if (pGVar5 == (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    return GMM_ERROR;
  }
  paVar1 = &pGVar5[1].field_1;
  *(byte *)paVar1 = *(byte *)paVar1 & 0xfe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[1].field_1.Value = pGVar5[1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[2].field_1.Value = pGVar5[2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[3].field_1.Value = pGVar5[3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[4].field_1.Value = pGVar5[4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[5].field_1.Value = pGVar5[5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[6].field_1.Value = pGVar5[6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[7].field_1.Value = pGVar5[7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[8].field_1.Value = pGVar5[8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[9].field_1.Value = pGVar5[9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[10].field_1.Value = pGVar5[10].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb].field_1.Value = pGVar5[0xb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x14].field_1.Value = pGVar5[0x14].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc].field_1.Value = pGVar5[0xc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd].field_1.Value = pGVar5[0xd].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe].field_1.Value = pGVar5[0xe].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xf].field_1.Value = pGVar5[0xf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x10].field_1.Value = pGVar5[0x10].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x11].field_1.Value = pGVar5[0x11].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x12].field_1.Value = pGVar5[0x12].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x13].field_1.Value = pGVar5[0x13].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x15].field_1.Value = pGVar5[0x15].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x16].field_1.Value = pGVar5[0x16].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  (pGVar5->field_1).Value = (pGVar5->field_1).Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x17].field_1.Value = pGVar5[0x17].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x18].field_1.Value = pGVar5[0x18].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x19].field_1.Value = pGVar5[0x19].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x1a].field_1.Value = pGVar5[0x1a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x1b].field_1.Value = pGVar5[0x1b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x1c].field_1.Value = pGVar5[0x1c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x1d].field_1.Value = pGVar5[0x1d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x1e].field_1.Value = pGVar5[0x1e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x1f].field_1.Value = pGVar5[0x1f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x20].field_1.Value = pGVar5[0x20].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x22].field_1.Value = pGVar5[0x22].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x23].field_1.Value = pGVar5[0x23].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x24].field_1.Value = pGVar5[0x24].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x25].field_1.Value = pGVar5[0x25].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x26].field_1.Value = pGVar5[0x26].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x27].field_1.Value = pGVar5[0x27].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x28].field_1.Value =
       (pGVar5[0x28].field_1.Value & 0xfffffffffffbffff |
       *(ulong *)&(((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                    super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                    super_GmmCachePolicyCommon.pGmmLibContext)->WaTable).field_0x4 >> 0x22 & 0x40000
       ) ^ 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x28].field_1.Value = pGVar5[0x28].field_1.Value & 0xffffffffe3ffffff | 0x8000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x29].field_1.Value = pGVar5[0x29].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x2a].field_1.Value = pGVar5[0x2a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x2b].field_1.Value = pGVar5[0x2b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x2c].field_1.Value = pGVar5[0x2c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x2d].field_1.Value = pGVar5[0x2d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x2e].field_1.Value = pGVar5[0x2e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x2f].field_1.Value = pGVar5[0x2f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x30].field_1.Value = pGVar5[0x30].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x32].field_1.Value = pGVar5[0x32].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x33].field_1.Value = pGVar5[0x33].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x35].field_1.Value = pGVar5[0x35].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x36].field_1.Value = pGVar5[0x36].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x37].field_1.Value = pGVar5[0x37].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x38].field_1.Value = pGVar5[0x38].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x39].field_1.Value = pGVar5[0x39].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x3a].field_1.Value = pGVar5[0x3a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x3b].field_1.Value = pGVar5[0x3b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x3e].field_1.Value = pGVar5[0x3e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x41].field_1.Value = pGVar5[0x41].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x42].field_1.Value = pGVar5[0x42].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x43].field_1.Value = pGVar5[0x43].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x40].field_1.Value = pGVar5[0x40].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x44].field_1.Value = pGVar5[0x44].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x47].field_1.Value = pGVar5[0x47].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x4d].field_1.Value = pGVar5[0x4d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x48].field_1.Value = pGVar5[0x48].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x49].field_1.Value = pGVar5[0x49].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x4a].field_1.Value = pGVar5[0x4a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x4b].field_1.Value = pGVar5[0x4b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x4c].field_1.Value = pGVar5[0x4c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x50].field_1.Value = pGVar5[0x50].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x51].field_1.Value = pGVar5[0x51].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x52].field_1.Value = pGVar5[0x52].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x53].field_1.Value = pGVar5[0x53].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x54].field_1.Value = pGVar5[0x54].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x5d].field_1.Value = pGVar5[0x5d].field_1.Value & 0xffffffffe3ffffff | 0x8000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x55].field_1.Value = pGVar5[0x55].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x56].field_1.Value = pGVar5[0x56].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x5c].field_1.Value = pGVar5[0x5c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x5e].field_1.Value = pGVar5[0x5e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x5f].field_1.Value = pGVar5[0x5f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x60].field_1.Value = pGVar5[0x60].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x61].field_1.Value = pGVar5[0x61].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x62].field_1.Value = pGVar5[0x62].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[99].field_1.Value = pGVar5[99].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[99].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[100].field_1.Value = pGVar5[100].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[100].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x6d].field_1.Value = pGVar5[0x6d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x6e].field_1.Value = pGVar5[0x6e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x70].field_1.Value = pGVar5[0x70].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x71].field_1.Value = pGVar5[0x71].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x73].field_1.Value = pGVar5[0x73].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x75].field_1.Value = pGVar5[0x75].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x76].field_1.Value = pGVar5[0x76].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x77].field_1.Value = pGVar5[0x77].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x78].field_1.Value = pGVar5[0x78].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x79].field_1.Value = pGVar5[0x79].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x7a].field_1.Value = pGVar5[0x7a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x7b].field_1.Value = pGVar5[0x7b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x7c].field_1.Value = pGVar5[0x7c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x7d].field_1.Value = pGVar5[0x7d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x7e].field_1.Value = pGVar5[0x7e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x7f].field_1.Value = pGVar5[0x7f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x80].field_1.Value = pGVar5[0x80].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x81].field_1.Value = pGVar5[0x81].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x82].field_1.Value = pGVar5[0x82].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x83].field_1.Value = pGVar5[0x83].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x84].field_1.Value = pGVar5[0x84].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x85].field_1.Value = pGVar5[0x85].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x86].field_1.Value = pGVar5[0x86].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x87].field_1.Value = pGVar5[0x87].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x88].field_1.Value = pGVar5[0x88].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x89].field_1.Value = pGVar5[0x89].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x8a].field_1.Value = pGVar5[0x8a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x8b].field_1.Value = pGVar5[0x8b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x8c].field_1.Value = pGVar5[0x8c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x8d].field_1.Value = pGVar5[0x8d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x8e].field_1.Value = pGVar5[0x8e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x8f].field_1.Value = pGVar5[0x8f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x90].field_1.Value = pGVar5[0x90].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa1].field_1.Value = pGVar5[0xa1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa2].field_1.Value = pGVar5[0xa2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x99].field_1.Value = pGVar5[0x99].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x9a].field_1.Value = pGVar5[0x9a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x9b].field_1.Value = pGVar5[0x9b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x9c].field_1.Value = pGVar5[0x9c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x9d].field_1.Value = pGVar5[0x9d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x9e].field_1.Value = pGVar5[0x9e].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x9f].field_1.Value = pGVar5[0x9f].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x9f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa0].field_1.Value = pGVar5[0xa0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa4].field_1.Value = pGVar5[0xa4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa5].field_1.Value = pGVar5[0xa5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa6].field_1.Value = pGVar5[0xa6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa7].field_1.Value = pGVar5[0xa7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa8].field_1.Value = pGVar5[0xa8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb1].field_1.Value = pGVar5[0xb1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb2].field_1.Value = pGVar5[0xb2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb3].field_1.Value = pGVar5[0xb3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb4].field_1.Value = pGVar5[0xb4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x3c].field_1.Value = pGVar5[0x3c].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x3c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb5].field_1.Value = pGVar5[0xb5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb6].field_1.Value = pGVar5[0xb6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb7].field_1.Value = pGVar5[0xb7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb8].field_1.Value = pGVar5[0xb8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb9].field_1.Value = pGVar5[0xb9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xba].field_1.Value = pGVar5[0xba].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xba].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xbb].field_1.Value = pGVar5[0xbb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xbc].field_1.Value = pGVar5[0xbc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xbd].field_1.Value = pGVar5[0xbd].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbd].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xbe].field_1.Value = pGVar5[0xbe].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbe].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xbf].field_1.Value = pGVar5[0xbf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xbf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc0].field_1.Value = pGVar5[0xc0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc1].field_1.Value = pGVar5[0xc1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc2].field_1.Value = pGVar5[0xc2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc3].field_1.Value = pGVar5[0xc3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc4].field_1.Value = pGVar5[0xc4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc5].field_1.Value = pGVar5[0xc5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc6].field_1.Value = pGVar5[0xc6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[199].field_1.Value = pGVar5[199].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[199].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[200].field_1.Value = pGVar5[200].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[200].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xc9].field_1.Value = pGVar5[0xc9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xc9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xca].field_1.Value = pGVar5[0xca].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xca].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xcb].field_1.Value = pGVar5[0xcb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xcc].field_1.Value = pGVar5[0xcc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xcd].field_1.Value = pGVar5[0xcd].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcd].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xce].field_1.Value = pGVar5[0xce].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xce].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xcf].field_1.Value = pGVar5[0xcf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xcf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd0].field_1.Value = pGVar5[0xd0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd1].field_1.Value = pGVar5[0xd1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd2].field_1.Value = pGVar5[0xd2].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd3].field_1.Value = pGVar5[0xd3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd4].field_1.Value = pGVar5[0xd4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd5].field_1.Value = pGVar5[0xd5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd6].field_1.Value = pGVar5[0xd6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd7].field_1.Value = pGVar5[0xd7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd8].field_1.Value = pGVar5[0xd8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xd9].field_1.Value = pGVar5[0xd9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xd9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xda].field_1.Value = pGVar5[0xda].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xda].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x91].field_1.Value = pGVar5[0x91].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x91].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xa9].field_1.Value = pGVar5[0xa9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xa9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xaa].field_1.Value = pGVar5[0xaa].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaa].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xab].field_1.Value = pGVar5[0xab].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xab].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xac].field_1.Value = pGVar5[0xac].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xac].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xad].field_1.Value = pGVar5[0xad].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xad].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x97].field_1.Value = pGVar5[0x97].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x97].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xae].field_1.Value = pGVar5[0xae].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xae].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xaf].field_1.Value = pGVar5[0xaf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xaf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xb0].field_1.Value = pGVar5[0xb0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xb0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xdc].field_1.Value = pGVar5[0xdc].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xde].field_1.Value = pGVar5[0xde].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xdf].field_1.Value = pGVar5[0xdf].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe0].field_1.Value = pGVar5[0xe0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe1].field_1.Value = pGVar5[0xe1].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 0x40000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe3].field_1.Value = pGVar5[0xe3].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe4].field_1.Value = pGVar5[0xe4].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe5].field_1.Value = pGVar5[0xe5].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe6].field_1.Value = pGVar5[0xe6].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe7].field_1.Value = pGVar5[0xe7].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe8].field_1.Value = pGVar5[0xe8].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xe9].field_1.Value = pGVar5[0xe9].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xea].field_1.Value = pGVar5[0xea].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xeb].field_1.Value = pGVar5[0xeb].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xed].field_1.Value = pGVar5[0xed].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0xf0].field_1.Value = pGVar5[0xf0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x118].field_1.Value = pGVar5[0x118].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value | 0x2000000;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x119].field_1.Value = pGVar5[0x119].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x11a].field_1.Value = pGVar5[0x11a].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value | 0x1000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar5 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
           super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
  ;
  pGVar5[0x11b].field_1.Value = pGVar5[0x11b].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  local_38 = this;
  SetUpMOCSTable(this);
  if ((((local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext)
       ->pPlatformInfo->Data).Platform.eProductFamily == IGFX_PVC) {
    SetupPAT(local_38);
  }
  uVar21 = 0;
  do {
    local_48 = 0;
    PVar2 = (((local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
              super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
              super_GmmCachePolicyCommon.pGmmLibContext)->pPlatformInfo->Data).Platform.
            eProductFamily;
    uVar16 = 0xffffffff;
    Usage = (uint32_t)uVar21;
    if ((int)PVar2 < 0x4f6) {
      bVar24 = true;
      if ((int)Usage < 0x3b) {
        if (Usage == 0x1d) {
          uVar16 = 0x3c;
        }
        else if (Usage == 0x39) {
          uVar16 = 0x3e;
        }
        else {
          if (Usage != 0x3a) goto LAB_00195087;
          uVar16 = 0x3f;
        }
      }
      else {
        if (1 < Usage - 0x3b) goto LAB_00195087;
        uVar16 = 0x3d;
      }
    }
    else {
LAB_00195087:
      bVar24 = false;
    }
    pGVar5 = (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
             super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
             super_GmmCachePolicyCommon.pCachePolicy;
    uVar6 = pGVar5[uVar21].field_1.Value;
    uVar12 = (ushort)uVar6 & 4;
    uVar19 = ((ushort)(uVar6 >> 9) & 0xe) + 0x11 + uVar12 * 8;
    if ((uVar6 & 0x1c00) == 0) {
      uVar19 = uVar12 * 8 + 0x10;
    }
    if (PVar2 == IGFX_PVC) {
      pGVar5[uVar21].field_1.Value = uVar6 & 0xfffffffffeffffff;
      paVar1 = &(local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                super_GmmCachePolicyCommon.pCachePolicy[uVar21].field_1;
      paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
    }
    if ((!bVar24) &&
       (PVar3 = (((local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                  super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                  super_GmmCachePolicyCommon.pGmmLibContext)->pPlatformInfo->Data).Platform.
                eProductFamily, PVar3 != IGFX_PVC && 0x4e1 < (int)PVar3)) {
      uVar18 = (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
               super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
               super_GmmCachePolicyCommon.pCachePolicy[uVar21].field_1.Value;
      uVar9 = (ushort)(uVar18 >> 0x12);
      uVar12 = uVar9 & 0x40;
      if ((uVar18 & 4) != 0) {
        uVar12 = 0;
      }
      uVar19 = uVar19 | uVar9 & 0x80 | uVar12;
    }
    uVar18 = (ulong)(PVar2 != IGFX_DG2);
    uVar22 = (uint)(PVar2 != IGFX_DG2);
    if (bVar24) {
LAB_0019517d:
      uVar20 = (uint)uVar16;
    }
    else if (((uint)uVar6 >> 0x12 & 1) == 0 || 0x4e2 < (int)PVar2) {
      uVar23 = (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
               super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.CurrentMaxMocsIndex;
      if (uVar23 < uVar22) goto LAB_0019517d;
      uVar20 = uVar22;
      if (((ulong)(local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                  super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                  super_GmmCachePolicyCommon.pCachePolicy[uVar21].field_1 & 0x3000004) != 0) {
        do {
          bVar24 = ((local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                    super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                    super_GmmCachePolicyCommon.pGmmLibContext)->CachePolicyTbl[uVar18].L3.
                   UshortValue == uVar19;
          if (bVar24) {
            uVar16 = uVar18;
          }
          uVar20 = (uint)uVar16;
        } while ((!bVar24) && (uVar15 = (int)uVar18 + 1, uVar18 = (ulong)uVar15, uVar15 <= uVar23));
      }
    }
    else {
      uVar23 = (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
               super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex;
      if (uVar23 < 0x30) goto LAB_0019517d;
      pCVar7 = (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
               super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
               super_GmmCachePolicyCommon.pGmmLibContext;
      uVar15 = 0x31;
      do {
        uVar20 = uVar15 - 1;
        if ((pCVar7->CachePolicyTbl[uVar20].L3.UshortValue != uVar19) ||
           (bVar24 = true, pCVar7->CachePolicyTbl[uVar20].HDCL1 != '\x01')) {
          bVar24 = false;
          uVar20 = (uint)uVar16;
        }
        if (bVar24) break;
        uVar16 = (ulong)uVar20;
        bVar24 = uVar15 <= uVar23;
        uVar15 = uVar15 + 1;
      } while (bVar24);
    }
    if (uVar20 != 0xffffffff) {
      uVar22 = uVar20;
    }
    pGVar5 = (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
             super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
             super_GmmCachePolicyCommon.pCachePolicy;
    uVar4 = pGVar5[uVar21].Override;
    uVar8 = pGVar5[uVar21].IsOverridenByRegkey;
    CachePolicyUsage.PTE.field_4.HighDwordValue = uVar8;
    CachePolicyUsage.PTE.field_4.DwordValue = uVar4;
    pGVar13 = pGVar5 + uVar21;
    uVar10 = pGVar13->MemoryObjectOverride;
    uVar11 = pGVar13->field_3;
    CachePolicyUsage.field_1.Value._4_4_ = uVar11;
    CachePolicyUsage.field_1.Value._0_4_ = uVar10;
    CachePolicyUsage._0_8_ = pGVar5[uVar21].field_1.Value;
    CachePolicyUsage._16_8_ = *(GMM_PTE_CACHE_CONTROL_BITS *)(&pGVar13->MemoryObjectOverride + 2);
    CachePolicyUsage.Override = (int)in_stack_ffffffffffffffb0;
    CachePolicyUsage.IsOverridenByRegkey = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    PTEValue = uVar21;
    GmmGen8CachePolicy::GetUsagePTEValue
              ((GmmGen8CachePolicy *)local_38,CachePolicyUsage,Usage,&local_48);
    (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
    super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
    [uVar21].PTE.field_4.DwordValue = (uint32_t)local_48;
    (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
    super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
    [uVar21].PTE.field_4.HighDwordValue = 0;
    pGVar5 = (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
             super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
             super_GmmCachePolicyCommon.pCachePolicy;
    pGVar5[uVar21].MemoryObjectOverride.DwordValue =
         (pGVar5[uVar21].MemoryObjectOverride.DwordValue & 0xffffff81) + (uVar22 & 0x3f) * 2;
    (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
    super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
    [uVar21].Override = 0xffffffff;
    if ((((local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
         pGmmLibContext)->pPlatformInfo->Data).Platform.eProductFamily == IGFX_PVC) {
      bVar14 = (*(byte *)&(local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                          super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                          super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[uVar21].
                          field_1 & 4) >> 2;
      uVar22 = 1;
      do {
        uVar23 = uVar22 - 1;
        pGVar17 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)local_38,uVar23);
        if ((uint)bVar14 + (uint)bVar14 * 2 == ((uint)pGVar17 & 3)) break;
        bVar24 = uVar22 <= *(uint *)&(local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy
                                     .field_0x2c;
        uVar22 = uVar22 + 1;
        uVar23 = 0xffffffff;
      } while (bVar24);
      if (uVar23 == 0xffffffff) {
        uVar23 = 0;
      }
      (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
      [uVar21].field_3.PATIndex = uVar23;
      (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
      [uVar21].PTE.field_4.DwordValue = (uVar23 & 4) * 0x20 + (uVar23 & 3) * 8;
      (local_38->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy
      [uVar21].PTE.field_4.HighDwordValue =
           (uint)(((ulong)(uVar23 & 8) << 0x3b) >> 0x20) |
           (uint)(((ulong)(uVar23 & 0x10) << 0x39) >> 0x20);
      uVar21 = PTEValue;
    }
    uVar21 = uVar21 + 1;
    if (uVar21 == 0x11e) {
      return GMM_SUCCESS;
    }
  } while( true );
}

Assistant:

GMM_STATUS GmmLib::GmmGen12dGPUCachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, l3, l3_scc, hdcl1, go, uclookup, l1cc) DEFINE_CP_ELEMENT(usage, 0, 0, l3, 0, 0, 0, 0, l3_scc, 0, 0, 0, hdcl1, 0, 0, go, uclookup, l1cc, 0, 0, 0, 0, 0, 0)

#include "GmmGen12dGPUCachePolicy.h"

#define L3_UNCACHEABLE (0x1)
#define L3_WB_CACHEABLE (0x3)
#define L3_PAT_UNCACHEABLE (0x0)

#define DISABLE_SKIP_CACHING_CONTROL (0x0)
#define ENABLE_SKIP_CACHING_CONTROL (0x1)

#define DISABLE_SELF_SNOOP_OVERRIDE (0x0)
#define CLASS_SERVICE_ZERO (0x0)
#define GMM_GEN12_MAX_NUMBER_MOCS_INDEXES (60) // On TGL last four (#60-#63) are reserved by h/w, few? are sw configurable though (#60)
    {
        SetUpMOCSTable();
    }
    
    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC)
    {
        SetupPAT();
    }

    {
        // Define index of cache element
        uint32_t Usage = 0;

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
        void *pKmdGmmContext = NULL;

	OverrideCachePolicy(pKmdGmmContext);
#endif

        // Process the cache policy and fill in the look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool                         CachePolicyError = false;
            bool                         SpecialMOCS      = false;
            int32_t                      CPTblIdx = -1, PATIdx = -1;
            uint32_t                     j = 0, i = 0;
            uint64_t                     PTEValue        = 0;
            GMM_CACHE_POLICY_TBL_ELEMENT UsageEle        = {0};
            uint32_t                     StartMocsIdx    = 0;
            GMM_PRIVATE_PAT              UsagePATElement = {0};


            switch(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform))
            {
	        case IGFX_DG1:
                case IGFX_XE_HP_SDV:
	        case IGFX_PVC:
                    StartMocsIdx = 1; // Index 0 is reserved for Error
                    break;
                case IGFX_DG2:
		    // DG2 provides 2 wires for MOCS Registers, gives 4(2^2) indexes to program.
                    StartMocsIdx = 0;
                    break;
                default:
                    StartMocsIdx = 1;
                    break;
            }

            // No Special MOCS handling for next platform
            if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) < IGFX_DG2)
            {
                CPTblIdx = IsSpecialMOCSUsage((GMM_RESOURCE_USAGE_TYPE)Usage, SpecialMOCS);
            }

            // Applicable upto Xe_HP only
            if(pCachePolicy[Usage].HDCL1 &&
               (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) <= IGFX_XE_HP_SDV))
            {
                UsageEle.HDCL1 = 1;
            }

            UsageEle.L3.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                      // we can compare the unioned L3.UshortValue.
            UsageEle.L3.ESC          = DISABLE_SKIP_CACHING_CONTROL;
            UsageEle.L3.SCC          = 0;
            UsageEle.L3.Cacheability = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_UNCACHEABLE;

            if(pCachePolicy[Usage].L3_SCC)
            {
                UsageEle.L3.ESC = ENABLE_SKIP_CACHING_CONTROL;
                UsageEle.L3.SCC = (uint16_t)pCachePolicy[Usage].L3_SCC;
            }

	    if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC)
            {
                pCachePolicy[Usage].GlbGo    = 0;
                pCachePolicy[Usage].UcLookup = 0;
            }
            // Go/Lookup
            // N/A for SpecialMOCS
            // N/A for DG1, RKL, PVC
            // Applicable for IGFX_XE_HP_SDV and DG2 only
            if(!SpecialMOCS &&
               (FROMPRODUCT(XE_HP_SDV)) &&
               (GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) != IGFX_PVC))
            {
                if(pCachePolicy[Usage].L3 == 0)
                {
                    UsageEle.L3.GlobalGo = pCachePolicy[Usage].GlbGo;
                }
                UsageEle.L3.UCLookup = pCachePolicy[Usage].UcLookup;
                __GMM_ASSERT((pCachePolicy[Usage].UcLookup) || (pCachePolicy[Usage].L3 == 0 && pCachePolicy[Usage].UcLookup == 0));
            }


            //Special-case MOCS handling for MOCS Table Index 60-63
            if(CPTblIdx >= GMM_GEN12_MAX_NUMBER_MOCS_INDEXES)
            {
                GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[CPTblIdx];

                if(SpecialMOCS &&
                   !(TblEle->L3.UshortValue == UsageEle.L3.UshortValue))
                {
                    //Assert if being overwritten!
                    __GMM_ASSERT(TblEle->L3.UshortValue == 0);

                }
            }
            //For HDC L1 caching, MOCS Table index 48-59 should be used
            else if(UsageEle.HDCL1)
            {
                for(j = GMM_GEN10_HDCL1_MOCS_INDEX_START; j <= CurrentMaxL1HdcMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];                    
		    if(TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }
            else
            {
                for(j = StartMocsIdx; j <= CurrentMaxMocsIndex; j++)
                {
                    if(pCachePolicy[Usage].L3 == 0 &&
                       pCachePolicy[Usage].GlbGo == 0 &&
                       pCachePolicy[Usage].UcLookup == 0)
                    {
                        CPTblIdx = StartMocsIdx;
                        break;
                    }
                    else
                    {
                        GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];

                        if(TblEle->L3.UshortValue == UsageEle.L3.UshortValue)
                        {
                            CPTblIdx = j;
                            break;
                        }
                    }
                }
            }

            // Didn't find the caching settings in one of the already programmed lookup table entries.
            // Need to add a new lookup table entry.
            if(CPTblIdx == -1)
            {

                {
                    GMM_ASSERTDPF(false, "CRITICAL ERROR: Cache Policy Usage value specified by Client is not defined in Fixed MOCS Table!");

                    CachePolicyError = true;
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                    CurrentMaxMocsIndex);

                    // Set cache policy index to uncached.
                    CPTblIdx = StartMocsIdx;
                }
            }

            // PTE entries do not control caching on SKL+ (for legacy context)
            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }

            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;

	    pCachePolicy[Usage].MemoryObjectOverride.Gen12.Index = CPTblIdx;

            pCachePolicy[Usage].Override = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
            
            if(GFX_GET_CURRENT_PRODUCT(pGmmLibContext->GetPlatformInfo().Platform) == IGFX_PVC)
            {
                // PAT data
                {
                    UsagePATElement.Xe_HPC.Reserved = 0;

                    UsagePATElement.Xe_HPC.MemoryType = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_PAT_UNCACHEABLE;
                    
                    // try to find a match in static PAT table
                    for(i = 0; i <= CurrentMaxPATIndex; i++)
                    {
                        GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                        if(UsagePATElement.Xe_HPC.MemoryType == PAT.Xe_HPC.MemoryType)
                        {
                            PATIdx = i;
                            break;
                        }
                    }

                    if(PATIdx == -1)
                    {
                         GMM_ASSERTDPF(
                         "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                         "(we only support NumPATRegisters = %d)",
                         CurrentMaxPATIndex);
                         CachePolicyError = true;
                         // add rterror here <ToDo>
                          PATIdx = PAT0; // default to uncached PAT index 0: GMM_CP_NON_COHERENT_UC
                                           // Log Error using regkey to indicate the above error
                        
                    }
                }

                pCachePolicy[Usage].PATIndex           = PATIdx;
                pCachePolicy[Usage].PTE.DwordValue     = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) & 0xFFFFFFFF;
                pCachePolicy[Usage].PTE.HighDwordValue = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) >> 32;
            }
        }
    }

    return GMM_SUCCESS;
}